

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaTest_CheckMessageFieldIsCleared_Test::
~Proto3ArenaTest_CheckMessageFieldIsCleared_Test
          (Proto3ArenaTest_CheckMessageFieldIsCleared_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3ArenaTest, CheckMessageFieldIsCleared) {
  Arena arena;
  auto msg = Arena::Create<TestAllTypes>(&arena);

  // Referring to a saved pointer to a child message is never guaranteed to
  // work. IOW, protobufs do not guarantee pointer stability. This test only
  // does this to replicate (unsupported) user behaviors.
  auto child = msg->mutable_optional_foreign_message();
  child->set_c(100);
  msg->Clear();

  EXPECT_EQ(child->c(), 0);
}